

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

void update_effects(DUMB_IT_SIGRENDERER *sigrenderer)

{
  IT_CHANNEL *channel;
  char *pcVar1;
  char cVar2;
  IT_PLAYING *pIVar3;
  int iVar4;
  byte bVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  byte bVar10;
  int iVar11;
  IT_SAMPLE *sample;
  long lVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  float fVar16;
  
  bVar10 = sigrenderer->globalvolslide;
  if ((bVar10 != 0) &&
     (bVar5 = sigrenderer->globalvolume + bVar10, sigrenderer->globalvolume = bVar5, 0x80 < bVar5))
  {
    sigrenderer->globalvolume = ~bVar10 & 0x80;
  }
  cVar2 = sigrenderer->temposlide;
  if ((cVar2 != '\0') &&
     (iVar7 = sigrenderer->tempo + (int)cVar2, sigrenderer->tempo = iVar7, iVar7 < 0x20)) {
    iVar7 = 0x20;
    if (-1 < cVar2) {
      iVar7 = 0xff;
    }
    sigrenderer->tempo = iVar7;
  }
  lVar12 = 0;
  do {
    bVar10 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x2a];
    if ((bVar10 != 0) &&
       (bVar5 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x2c] + bVar10,
       sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x2c] = bVar5, 0x40 < bVar5)) {
      sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x2c] = (byte)~bVar10 >> 1 & 0x40;
    }
    cVar2 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x2b];
    if (cVar2 != '\0') {
      uVar8 = 0x40 - (((uint)sigrenderer->sigdata->flags >> 8 & 1) != 0);
      bVar10 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x2c] + cVar2;
      sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x2c] = bVar10;
      if (uVar8 < bVar10) {
        cVar6 = (char)uVar8;
        if (cVar2 < '\0') {
          cVar6 = '\0';
        }
        sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x2c] = cVar6;
      }
    }
    bVar10 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x29];
    if (bVar10 != 0) {
      bVar5 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x28];
      if ((sigrenderer->sigdata->flags & 0x40) == 0) {
        if (0x40 < bVar5) {
          sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x28] = ' ';
        }
        bVar5 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x28] + bVar10;
        bVar10 = (byte)~bVar10 >> 1 & 0x40;
        if (bVar5 < 0x41) {
          bVar10 = bVar5;
        }
        sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x28] = bVar10;
        iVar7 = (uint)bVar10 << 8;
      }
      else {
        if (0x40 < bVar5) {
          sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x28] = ' ';
          pcVar1 = sigrenderer->channel[0].arpeggio_offsets + lVar12 + -0x26;
          pcVar1[0] = ' ';
          pcVar1[1] = ' ';
        }
        iVar7 = (char)bVar10 * 0x40 +
                (uint)*(ushort *)(sigrenderer->channel[0].arpeggio_offsets + lVar12 + -0x26);
        if (0x3fdf < iVar7) {
          iVar7 = 0x3fe0;
        }
        if (iVar7 < 0x21) {
          iVar7 = 0x20;
        }
      }
      *(short *)(sigrenderer->channel[0].arpeggio_offsets + lVar12 + -0x26) = (short)iVar7;
    }
    bVar10 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x23];
    if ((bVar10 != 0) &&
       (bVar5 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x24] + bVar10,
       sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x24] = bVar5, 0x40 < bVar5)) {
      sigrenderer->channel[0].arpeggio_offsets[lVar12 + -0x24] = (byte)~bVar10 >> 1 & 0x40;
    }
    channel = (IT_CHANNEL *)(sigrenderer->channel[0].arpeggio_offsets + lVar12 + -0x30);
    pIVar3 = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar12 + 0x58);
    update_tremor(channel);
    update_retrig(sigrenderer,channel);
    if (sigrenderer->channel[0].arpeggio_offsets[lVar12 + 0x4d] != '\0') {
      if (pIVar3 == (IT_PLAYING *)0x0) {
        sample = (IT_SAMPLE *)0x0;
      }
      else {
        sample = pIVar3->sample;
      }
      update_invert_loop(channel,sample);
    }
    if (pIVar3 != (IT_PLAYING *)0x0) {
      iVar11 = pIVar3->slide + *(int *)(sigrenderer->channel[0].arpeggio_offsets + lVar12 + 0x18);
      pIVar3->slide = iVar11;
      iVar7 = *(int *)(sigrenderer->channel[0].arpeggio_offsets + lVar12 + 0x1c);
      if ((sigrenderer->sigdata->flags & 8) == 0) {
        if (iVar7 != 0) {
          bVar10 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + 0x29];
          if (bVar10 < 0x78) {
            fVar13 = (float)pIVar3->sample->C5_speed * 1.7621046e-08;
            dVar15 = exp2((double)(int)(0x3c - (uint)pIVar3->note) * 0.0833333333333334);
            fVar16 = (float)dVar15;
            dVar15 = exp2((double)(int)(0x3c - (uint)bVar10) * 0.0833333333333334);
            fVar14 = (float)dVar15;
            if (fVar14 <= fVar16 - (float)iVar11 * fVar13) {
              pIVar3->slide = iVar7 + iVar11;
              if (fVar16 - fVar13 * (float)(iVar7 + iVar11) < fVar14) goto LAB_005b4459;
            }
            else {
              pIVar3->slide = iVar11 - iVar7;
              if (fVar14 < fVar16 - fVar13 * (float)(iVar11 - iVar7)) {
LAB_005b4459:
                pIVar3->note = bVar10;
                pIVar3->slide = 0;
                sigrenderer->channel[0].arpeggio_offsets[lVar12 + 0x29] = -1;
              }
            }
          }
        }
      }
      else if ((iVar7 != 0) &&
              (bVar10 = sigrenderer->channel[0].arpeggio_offsets[lVar12 + 0x29], bVar10 < 0x78)) {
        iVar4 = (uint)pIVar3->note * 0x100;
        iVar11 = iVar4 + iVar11 + -0x3c00;
        iVar9 = (uint)bVar10 * 0x100 + -0x3c00;
        if (iVar9 < iVar11) {
          iVar11 = iVar11 - iVar7;
          if (iVar11 < iVar9) {
LAB_005b4476:
            sigrenderer->channel[0].arpeggio_offsets[lVar12 + 0x29] = -1;
            iVar11 = iVar9;
          }
        }
        else if ((iVar11 < iVar9) && (iVar11 = iVar11 + iVar7, iVar9 < iVar11)) goto LAB_005b4476;
        pIVar3->slide = iVar11 - (iVar4 + -0x3c00);
      }
      update_playing_effects(pIVar3);
    }
    lVar12 = lVar12 + 0xa0;
    if (lVar12 == 0x2800) {
      lVar12 = 0x504;
      do {
        pIVar3 = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar12 * 8 + -0x50);
        if (pIVar3 != (IT_PLAYING *)0x0) {
          update_playing_effects(pIVar3);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x5c4);
      update_smooth_effects(sigrenderer);
      return;
    }
  } while( true );
}

Assistant:

static void update_effects(DUMB_IT_SIGRENDERER *sigrenderer)
{
    int i;

	if (sigrenderer->globalvolslide) {
		sigrenderer->globalvolume += sigrenderer->globalvolslide;
		if (sigrenderer->globalvolume > 128) {
			if (sigrenderer->globalvolslide >= 0)
				sigrenderer->globalvolume = 128;
			else
				sigrenderer->globalvolume = 0;
		}
	}

	if (sigrenderer->temposlide) {
		sigrenderer->tempo += sigrenderer->temposlide;
		if (sigrenderer->tempo < 32) {
			if (sigrenderer->temposlide >= 0)
				sigrenderer->tempo = 255;
			else
				sigrenderer->tempo = 32;
		}
	}

	for (i = 0; i < DUMB_IT_N_CHANNELS; i++) {
		IT_CHANNEL *channel = &sigrenderer->channel[i];
		IT_PLAYING *playing = channel->playing;

		if (channel->xm_volslide) {
			channel->volume += channel->xm_volslide;
			if (channel->volume > 64) {
				if (channel->xm_volslide >= 0)
					channel->volume = 64;
				else
					channel->volume = 0;
			}
		}

		if (channel->volslide) {
			int clip = (sigrenderer->sigdata->flags & IT_WAS_AN_S3M) ? 63 : 64;
			channel->volume += channel->volslide;
			if (channel->volume > clip) {
				if (channel->volslide >= 0)
					channel->volume = clip;
				else
					channel->volume = 0;
			}
		}

		if (channel->panslide) {
			if (sigrenderer->sigdata->flags & IT_WAS_AN_XM) {
				if (IT_IS_SURROUND(channel->pan))
				{
					channel->pan = 32;
					channel->truepan = 32 + 128 * 64;
				}
				if (channel->panslide == -128)
					channel->truepan = 32;
				else
					channel->truepan = MID(32, channel->truepan + channel->panslide*64, 32+255*64);
			} else {
				if (IT_IS_SURROUND(channel->pan))
				{
					channel->pan = 32;
				}
				channel->pan += channel->panslide;
				if (channel->pan > 64) {
					if (channel->panslide >= 0)
						channel->pan = 64;
					else
						channel->pan = 0;
				}
				channel->truepan = channel->pan << IT_ENVELOPE_SHIFT;
			}
		}

		if (channel->channelvolslide) {
			channel->channelvolume += channel->channelvolslide;
			if (channel->channelvolume > 64) {
				if (channel->channelvolslide >= 0)
					channel->channelvolume = 64;
				else
					channel->channelvolume = 0;
			}
		}

		update_tremor(channel);

		update_retrig(sigrenderer, channel);

		if (channel->inv_loop_speed) update_invert_loop(channel, playing ? playing->sample : NULL);

		if (playing) {
			playing->slide += channel->portamento;

			if (sigrenderer->sigdata->flags & IT_LINEAR_SLIDES) {
				if (channel->toneporta && channel->destnote < 120) {
					int currpitch = ((playing->note - 60) << 8) + playing->slide;
					int destpitch = (channel->destnote - 60) << 8;
					if (currpitch > destpitch) {
						currpitch -= channel->toneporta;
						if (currpitch < destpitch) {
							currpitch = destpitch;
							channel->destnote = IT_NOTE_OFF;
						}
					} else if (currpitch < destpitch) {
						currpitch += channel->toneporta;
						if (currpitch > destpitch) {
							currpitch = destpitch;
							channel->destnote = IT_NOTE_OFF;
						}
					}
					playing->slide = currpitch - ((playing->note - 60) << 8);
				}
			} else {
				if (channel->toneporta && channel->destnote < 120) {
					float amiga_multiplier = playing->sample->C5_speed * (1.0f / AMIGA_DIVISOR);

					float deltanote = (float)pow(DUMB_SEMITONE_BASE, 60 - playing->note);
					/* deltanote is 1.0 for C-5, 0.5 for C-6, etc. */

					float deltaslid = deltanote - playing->slide * amiga_multiplier;

					float destdelta = (float)pow(DUMB_SEMITONE_BASE, 60 - channel->destnote);
					if (deltaslid < destdelta) {
						playing->slide -= channel->toneporta;
						deltaslid = deltanote - playing->slide * amiga_multiplier;
						if (deltaslid > destdelta) {
							playing->note = channel->destnote;
							playing->slide = 0;
							channel->destnote = IT_NOTE_OFF;
						}
					} else {
						playing->slide += channel->toneporta;
						deltaslid = deltanote - playing->slide * amiga_multiplier;
						if (deltaslid < destdelta) {
							playing->note = channel->destnote;
							playing->slide = 0;
							channel->destnote = IT_NOTE_OFF;
						}
					}
				}
			}

			update_playing_effects(playing);
		}
	}

	for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
		IT_PLAYING *playing = sigrenderer->playing[i];
		if (playing) update_playing_effects(playing);
	}

	update_smooth_effects(sigrenderer);
}